

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

shared_ptr<char> __thiscall QUtil::make_shared_cstr(QUtil *this,string *str)

{
  long lVar1;
  element_type *peVar2;
  void *__src;
  size_t __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<char> sVar3;
  string *str_local;
  shared_ptr<char> *result;
  
  lVar1 = std::__cxx11::string::length();
  make_shared_array<char>(this,lVar1 + 1);
  peVar2 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)this);
  lVar1 = std::__cxx11::string::length();
  peVar2[lVar1] = '\0';
  peVar2 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)this);
  __src = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::length();
  memcpy(peVar2,__src,__n);
  sVar3.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<char>)sVar3.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<char>
QUtil::make_shared_cstr(std::string const& str)
{
    auto result = QUtil::make_shared_array<char>(str.length() + 1);
    // Use memcpy in case string contains nulls
    result.get()[str.length()] = '\0';
    memcpy(result.get(), str.c_str(), str.length());
    return result;
}